

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_dynamic_suite::dynamic_back(void)

{
  initializer_list<int> input;
  reference piVar1;
  undefined4 local_6c [2];
  undefined4 local_64 [2];
  undefined4 local_5c [2];
  int local_54 [3];
  iterator local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  memset(&span.member.next,0,0x10);
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  local_54[0] = 0xb;
  local_54[1] = 0x16;
  local_54[2] = 0x21;
  local_48 = local_54;
  local_40 = 3;
  input._M_len = 3;
  input._M_array = local_48;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back
                     ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_5c[0] = 0x21;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe5,"void api_dynamic_suite::dynamic_back()",piVar1,local_5c);
  vista::circular_view<int,_18446744073709551615UL>::push_front
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x2c);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back
                     ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_64[0] = 0x21;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe7,"void api_dynamic_suite::dynamic_back()",piVar1,local_64);
  vista::circular_view<int,_18446744073709551615UL>::push_front
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x37);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back
                     ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_6c[0] = 0x16;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe9,"void api_dynamic_suite::dynamic_back()",piVar1,local_6c);
  return;
}

Assistant:

void dynamic_back()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = {11, 22, 33};
    BOOST_TEST_EQ(span.back(), 33);
    span.push_front(44);
    BOOST_TEST_EQ(span.back(), 33);
    span.push_front(55);
    BOOST_TEST_EQ(span.back(), 22);
}